

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_or(int n,...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_100;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  mpc_parser_t *local_30;
  mpc_parser_t *p;
  va_list va;
  int i;
  int n_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  va[0].reg_save_area._4_4_ = n;
  local_30 = mpc_undefined();
  local_30->type = '\x17';
  (local_30->data).repeat.n = va[0].reg_save_area._4_4_;
  pvVar1 = malloc((long)va[0].reg_save_area._4_4_ << 3);
  (local_30->data).lift.x = pvVar1;
  va[0]._0_8_ = &stack0x00000008;
  p._0_4_ = 8;
  for (va[0].reg_save_area._0_4_ = 0; (int)va[0].reg_save_area < va[0].reg_save_area._4_4_;
      va[0].reg_save_area._0_4_ = (int)va[0].reg_save_area + 1) {
    if ((uint)p < 0x29) {
      local_100 = (undefined8 *)((long)local_e8 + (long)(int)(uint)p);
      p._0_4_ = (uint)p + 8;
    }
    else {
      local_100 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    *(undefined8 *)((long)(local_30->data).lift.x + (long)(int)va[0].reg_save_area * 8) = *local_100
    ;
  }
  return local_30;
}

Assistant:

mpc_parser_t *mpc_or(int n, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_OR;
  p->data.or.n = n;
  p->data.or.xs = malloc(sizeof(mpc_parser_t*) * n);

  va_start(va, n);
  for (i = 0; i < n; i++) {
    p->data.or.xs[i] = va_arg(va, mpc_parser_t*);
  }
  va_end(va);

  return p;
}